

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O1

matrix<int,_2UL> * __thiscall
trng::power<int,2ul>
          (matrix<int,_2UL> *__return_storage_ptr__,trng *this,matrix<int,_2UL> *a,
          unsigned_long_long m)

{
  pointer piVar1;
  bool bVar2;
  matrix<int,_2UL> local_58;
  matrix<int,_2UL> local_38;
  
  matrix<int,2ul>::
  matrix<trng::power<int,2ul>(trng::matrix<int,2ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38.data,(vector<int,_std::allocator<int>_> *)this);
  if (a != (matrix<int,_2UL> *)0x0) {
    do {
      if (((ulong)a & 1) != 0) {
        operator*(&local_58,__return_storage_ptr__,&local_38);
        piVar1 = (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        if (piVar1 != (pointer)0x0) {
          operator_delete(piVar1);
        }
        if (local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (a == (matrix<int,_2UL> *)0x1) break;
      operator*(&local_58,&local_38,&local_38);
      piVar1 = local_38.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_38.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_38.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (piVar1 != (pointer)0x0) {
        operator_delete(piVar1);
      }
      if (local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar2 = a != (matrix<int,_2UL> *)0x0;
      a = (matrix<int,_2UL> *)((ulong)a >> 1);
    } while (bVar2);
  }
  if (local_38.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }